

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_event_reader.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
next(cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this)

{
  ser_error *this_00;
  undefined8 extraout_RAX;
  error_code ec_00;
  error_code ec;
  uint local_20 [2];
  error_category *local_18;
  
  local_20[0] = 0;
  local_18 = (error_category *)std::_V2::system_category();
  (*(this->super_basic_staj_event_reader<char>)._vptr_basic_staj_event_reader[8])(this,local_20);
  if (local_20[0] == 0) {
    return;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = local_20[0];
  ec_00._M_cat = local_18;
  ser_error::ser_error(this_00,ec_00,0,(this->parser_).source_.position_);
  cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::next
            ((cbor_event_reader<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             this_00);
  __cxa_free_exception(this_00);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void next() override
        {
            std::error_code ec;
            next(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
            }
        }